

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IndelLengthDistribution.cpp
# Opt level: O0

ostream * operator<<(ostream *os,IndelLengthDistribution *ild)

{
  code *pcVar1;
  size_type sVar2;
  const_reference pvVar3;
  vector<int,_std::allocator<int>_> *in_RSI;
  ostream *in_RDI;
  size_t i;
  undefined8 local_18;
  
  std::operator<<(in_RDI,'[');
  local_18 = 0;
  while( true ) {
    sVar2 = std::vector<int,_std::allocator<int>_>::size(in_RSI);
    if (sVar2 <= local_18) break;
    if (local_18 != 0) {
      std::operator<<(in_RDI,',');
    }
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](in_RSI,local_18);
    std::ostream::operator<<(in_RDI,*pvVar3);
    local_18 = local_18 + 1;
  }
  std::operator<<(in_RDI,']');
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

std::ostream& operator<<(std::ostream& os, const IndelLengthDistribution& ild) {
	os << '[';
	for (size_t i=0; i<ild.phred_costs.size(); ++i) {
		if (i>0) os << ',';
		os << ild.phred_costs[i];
	}
	os << ']';
}